

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

void __thiscall
Diligent::GetTextureFormatAttribs::FormatToTextureFormatAttribsMap::FormatToTextureFormatAttribsMap
          (FormatToTextureFormatAttribsMap *this)

{
  reference pvVar1;
  Char *Message;
  TextureFormatAttribs *local_6e0;
  undefined1 local_6c8 [8];
  string msg;
  undefined1 auStack_6a0 [4];
  Uint32 Fmt;
  TEXTURE_FORMAT local_698;
  Uint8 UStack_696;
  Uint8 UStack_695;
  COMPONENT_TYPE CStack_694;
  Bool BStack_693;
  Uint8 UStack_692;
  Uint8 UStack_691;
  TextureFormatAttribs local_690;
  TextureFormatAttribs local_680;
  TextureFormatAttribs local_670;
  TextureFormatAttribs local_660;
  TextureFormatAttribs local_650;
  TextureFormatAttribs local_640;
  TextureFormatAttribs local_630;
  TextureFormatAttribs local_620;
  TextureFormatAttribs local_610;
  TextureFormatAttribs local_600;
  TextureFormatAttribs local_5f0;
  TextureFormatAttribs local_5e0;
  TextureFormatAttribs local_5d0;
  TextureFormatAttribs local_5c0;
  TextureFormatAttribs local_5b0;
  TextureFormatAttribs local_5a0;
  TextureFormatAttribs local_590;
  TextureFormatAttribs local_580;
  TextureFormatAttribs local_570;
  TextureFormatAttribs local_560;
  TextureFormatAttribs local_550;
  TextureFormatAttribs local_540;
  TextureFormatAttribs local_530;
  TextureFormatAttribs local_520;
  TextureFormatAttribs local_510;
  TextureFormatAttribs local_500;
  TextureFormatAttribs local_4f0;
  TextureFormatAttribs local_4e0;
  TextureFormatAttribs local_4d0;
  TextureFormatAttribs local_4c0;
  TextureFormatAttribs local_4b0;
  TextureFormatAttribs local_4a0;
  TextureFormatAttribs local_490;
  TextureFormatAttribs local_480;
  TextureFormatAttribs local_470;
  TextureFormatAttribs local_460;
  TextureFormatAttribs local_450;
  TextureFormatAttribs local_440;
  TextureFormatAttribs local_430;
  TextureFormatAttribs local_420;
  TextureFormatAttribs local_410;
  TextureFormatAttribs local_400;
  TextureFormatAttribs local_3f0;
  TextureFormatAttribs local_3e0;
  TextureFormatAttribs local_3d0;
  TextureFormatAttribs local_3c0;
  TextureFormatAttribs local_3b0;
  TextureFormatAttribs local_3a0;
  TextureFormatAttribs local_390;
  TextureFormatAttribs local_380;
  TextureFormatAttribs local_370;
  TextureFormatAttribs local_360;
  TextureFormatAttribs local_350;
  TextureFormatAttribs local_340;
  TextureFormatAttribs local_330;
  TextureFormatAttribs local_320;
  TextureFormatAttribs local_310;
  TextureFormatAttribs local_300;
  TextureFormatAttribs local_2f0;
  TextureFormatAttribs local_2e0;
  TextureFormatAttribs local_2d0;
  TextureFormatAttribs local_2c0;
  TextureFormatAttribs local_2b0;
  TextureFormatAttribs local_2a0;
  TextureFormatAttribs local_290;
  TextureFormatAttribs local_280;
  TextureFormatAttribs local_270;
  TextureFormatAttribs local_260;
  TextureFormatAttribs local_250;
  TextureFormatAttribs local_240;
  TextureFormatAttribs local_230;
  TextureFormatAttribs local_220;
  TextureFormatAttribs local_210;
  TextureFormatAttribs local_200;
  TextureFormatAttribs local_1f0;
  TextureFormatAttribs local_1e0;
  TextureFormatAttribs local_1d0;
  TextureFormatAttribs local_1c0;
  TextureFormatAttribs local_1b0;
  TextureFormatAttribs local_1a0;
  TextureFormatAttribs local_190;
  TextureFormatAttribs local_180;
  TextureFormatAttribs local_170;
  TextureFormatAttribs local_160;
  TextureFormatAttribs local_150;
  TextureFormatAttribs local_140;
  TextureFormatAttribs local_130;
  TextureFormatAttribs local_120;
  TextureFormatAttribs local_110;
  TextureFormatAttribs local_100;
  TextureFormatAttribs local_f0;
  TextureFormatAttribs local_e0;
  TextureFormatAttribs local_d0;
  TextureFormatAttribs local_c0;
  TextureFormatAttribs local_b0;
  TextureFormatAttribs local_a0;
  TextureFormatAttribs local_90;
  TextureFormatAttribs local_80;
  TextureFormatAttribs local_70;
  TextureFormatAttribs local_60;
  TextureFormatAttribs local_50;
  TextureFormatAttribs local_40;
  TextureFormatAttribs local_30;
  TextureFormatAttribs local_20;
  FormatToTextureFormatAttribsMap *local_10;
  FormatToTextureFormatAttribsMap *this_local;
  
  local_6e0 = (TextureFormatAttribs *)this;
  local_10 = this;
  do {
    TextureFormatAttribs::TextureFormatAttribs(local_6e0);
    local_6e0 = local_6e0 + 1;
  } while (local_6e0 != (TextureFormatAttribs *)(this + 1));
  TextureFormatAttribs::TextureFormatAttribs
            (&local_20,"TEX_FORMAT_RGBA32_TYPELESS",TEX_FORMAT_RGBA32_TYPELESS,'\x04','\x04',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,1);
  pvVar1->Name = local_20.Name;
  pvVar1->Format = local_20.Format;
  pvVar1->ComponentSize = local_20.ComponentSize;
  pvVar1->NumComponents = local_20.NumComponents;
  pvVar1->ComponentType = local_20.ComponentType;
  pvVar1->IsTypeless = local_20.IsTypeless;
  pvVar1->BlockWidth = local_20.BlockWidth;
  pvVar1->BlockHeight = local_20.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_30,"TEX_FORMAT_RGBA32_FLOAT",TEX_FORMAT_RGBA32_FLOAT,'\x04','\x04',
             COMPONENT_TYPE_FLOAT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,2);
  pvVar1->Name = local_30.Name;
  pvVar1->Format = local_30.Format;
  pvVar1->ComponentSize = local_30.ComponentSize;
  pvVar1->NumComponents = local_30.NumComponents;
  pvVar1->ComponentType = local_30.ComponentType;
  pvVar1->IsTypeless = local_30.IsTypeless;
  pvVar1->BlockWidth = local_30.BlockWidth;
  pvVar1->BlockHeight = local_30.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_40,"TEX_FORMAT_RGBA32_UINT",TEX_FORMAT_RGBA32_UINT,'\x04','\x04',
             COMPONENT_TYPE_UINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,3);
  pvVar1->Name = local_40.Name;
  pvVar1->Format = local_40.Format;
  pvVar1->ComponentSize = local_40.ComponentSize;
  pvVar1->NumComponents = local_40.NumComponents;
  pvVar1->ComponentType = local_40.ComponentType;
  pvVar1->IsTypeless = local_40.IsTypeless;
  pvVar1->BlockWidth = local_40.BlockWidth;
  pvVar1->BlockHeight = local_40.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_50,"TEX_FORMAT_RGBA32_SINT",TEX_FORMAT_RGBA32_SINT,'\x04','\x04',
             COMPONENT_TYPE_SINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,4);
  pvVar1->Name = local_50.Name;
  pvVar1->Format = local_50.Format;
  pvVar1->ComponentSize = local_50.ComponentSize;
  pvVar1->NumComponents = local_50.NumComponents;
  pvVar1->ComponentType = local_50.ComponentType;
  pvVar1->IsTypeless = local_50.IsTypeless;
  pvVar1->BlockWidth = local_50.BlockWidth;
  pvVar1->BlockHeight = local_50.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_60,"TEX_FORMAT_RGB32_TYPELESS",TEX_FORMAT_RGB32_TYPELESS,'\x04','\x03',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,5);
  pvVar1->Name = local_60.Name;
  pvVar1->Format = local_60.Format;
  pvVar1->ComponentSize = local_60.ComponentSize;
  pvVar1->NumComponents = local_60.NumComponents;
  pvVar1->ComponentType = local_60.ComponentType;
  pvVar1->IsTypeless = local_60.IsTypeless;
  pvVar1->BlockWidth = local_60.BlockWidth;
  pvVar1->BlockHeight = local_60.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_70,"TEX_FORMAT_RGB32_FLOAT",TEX_FORMAT_RGB32_FLOAT,'\x04','\x03',
             COMPONENT_TYPE_FLOAT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,6);
  pvVar1->Name = local_70.Name;
  pvVar1->Format = local_70.Format;
  pvVar1->ComponentSize = local_70.ComponentSize;
  pvVar1->NumComponents = local_70.NumComponents;
  pvVar1->ComponentType = local_70.ComponentType;
  pvVar1->IsTypeless = local_70.IsTypeless;
  pvVar1->BlockWidth = local_70.BlockWidth;
  pvVar1->BlockHeight = local_70.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_80,"TEX_FORMAT_RGB32_UINT",TEX_FORMAT_RGB32_UINT,'\x04','\x03',
             COMPONENT_TYPE_UINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,7);
  pvVar1->Name = local_80.Name;
  pvVar1->Format = local_80.Format;
  pvVar1->ComponentSize = local_80.ComponentSize;
  pvVar1->NumComponents = local_80.NumComponents;
  pvVar1->ComponentType = local_80.ComponentType;
  pvVar1->IsTypeless = local_80.IsTypeless;
  pvVar1->BlockWidth = local_80.BlockWidth;
  pvVar1->BlockHeight = local_80.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_90,"TEX_FORMAT_RGB32_SINT",TEX_FORMAT_RGB32_SINT,'\x04','\x03',
             COMPONENT_TYPE_SINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,8);
  pvVar1->Name = local_90.Name;
  pvVar1->Format = local_90.Format;
  pvVar1->ComponentSize = local_90.ComponentSize;
  pvVar1->NumComponents = local_90.NumComponents;
  pvVar1->ComponentType = local_90.ComponentType;
  pvVar1->IsTypeless = local_90.IsTypeless;
  pvVar1->BlockWidth = local_90.BlockWidth;
  pvVar1->BlockHeight = local_90.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_a0,"TEX_FORMAT_RGBA16_TYPELESS",TEX_FORMAT_RGBA16_TYPELESS,'\x02','\x04',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,9);
  pvVar1->Name = local_a0.Name;
  pvVar1->Format = local_a0.Format;
  pvVar1->ComponentSize = local_a0.ComponentSize;
  pvVar1->NumComponents = local_a0.NumComponents;
  pvVar1->ComponentType = local_a0.ComponentType;
  pvVar1->IsTypeless = local_a0.IsTypeless;
  pvVar1->BlockWidth = local_a0.BlockWidth;
  pvVar1->BlockHeight = local_a0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_b0,"TEX_FORMAT_RGBA16_FLOAT",TEX_FORMAT_RGBA16_FLOAT,'\x02','\x04',
             COMPONENT_TYPE_FLOAT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,10);
  pvVar1->Name = local_b0.Name;
  pvVar1->Format = local_b0.Format;
  pvVar1->ComponentSize = local_b0.ComponentSize;
  pvVar1->NumComponents = local_b0.NumComponents;
  pvVar1->ComponentType = local_b0.ComponentType;
  pvVar1->IsTypeless = local_b0.IsTypeless;
  pvVar1->BlockWidth = local_b0.BlockWidth;
  pvVar1->BlockHeight = local_b0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_c0,"TEX_FORMAT_RGBA16_UNORM",TEX_FORMAT_RGBA16_UNORM,'\x02','\x04',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0xb);
  pvVar1->Name = local_c0.Name;
  pvVar1->Format = local_c0.Format;
  pvVar1->ComponentSize = local_c0.ComponentSize;
  pvVar1->NumComponents = local_c0.NumComponents;
  pvVar1->ComponentType = local_c0.ComponentType;
  pvVar1->IsTypeless = local_c0.IsTypeless;
  pvVar1->BlockWidth = local_c0.BlockWidth;
  pvVar1->BlockHeight = local_c0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_d0,"TEX_FORMAT_RGBA16_UINT",TEX_FORMAT_RGBA16_UINT,'\x02','\x04',
             COMPONENT_TYPE_UINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0xc);
  pvVar1->Name = local_d0.Name;
  pvVar1->Format = local_d0.Format;
  pvVar1->ComponentSize = local_d0.ComponentSize;
  pvVar1->NumComponents = local_d0.NumComponents;
  pvVar1->ComponentType = local_d0.ComponentType;
  pvVar1->IsTypeless = local_d0.IsTypeless;
  pvVar1->BlockWidth = local_d0.BlockWidth;
  pvVar1->BlockHeight = local_d0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_e0,"TEX_FORMAT_RGBA16_SNORM",TEX_FORMAT_RGBA16_SNORM,'\x02','\x04',
             COMPONENT_TYPE_SNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0xd);
  pvVar1->Name = local_e0.Name;
  pvVar1->Format = local_e0.Format;
  pvVar1->ComponentSize = local_e0.ComponentSize;
  pvVar1->NumComponents = local_e0.NumComponents;
  pvVar1->ComponentType = local_e0.ComponentType;
  pvVar1->IsTypeless = local_e0.IsTypeless;
  pvVar1->BlockWidth = local_e0.BlockWidth;
  pvVar1->BlockHeight = local_e0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_f0,"TEX_FORMAT_RGBA16_SINT",TEX_FORMAT_RGBA16_SINT,'\x02','\x04',
             COMPONENT_TYPE_SINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0xe);
  pvVar1->Name = local_f0.Name;
  pvVar1->Format = local_f0.Format;
  pvVar1->ComponentSize = local_f0.ComponentSize;
  pvVar1->NumComponents = local_f0.NumComponents;
  pvVar1->ComponentType = local_f0.ComponentType;
  pvVar1->IsTypeless = local_f0.IsTypeless;
  pvVar1->BlockWidth = local_f0.BlockWidth;
  pvVar1->BlockHeight = local_f0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_100,"TEX_FORMAT_RG32_TYPELESS",TEX_FORMAT_RG32_TYPELESS,'\x04','\x02',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0xf);
  pvVar1->Name = local_100.Name;
  pvVar1->Format = local_100.Format;
  pvVar1->ComponentSize = local_100.ComponentSize;
  pvVar1->NumComponents = local_100.NumComponents;
  pvVar1->ComponentType = local_100.ComponentType;
  pvVar1->IsTypeless = local_100.IsTypeless;
  pvVar1->BlockWidth = local_100.BlockWidth;
  pvVar1->BlockHeight = local_100.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_110,"TEX_FORMAT_RG32_FLOAT",TEX_FORMAT_RG32_FLOAT,'\x04','\x02',
             COMPONENT_TYPE_FLOAT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x10);
  pvVar1->Name = local_110.Name;
  pvVar1->Format = local_110.Format;
  pvVar1->ComponentSize = local_110.ComponentSize;
  pvVar1->NumComponents = local_110.NumComponents;
  pvVar1->ComponentType = local_110.ComponentType;
  pvVar1->IsTypeless = local_110.IsTypeless;
  pvVar1->BlockWidth = local_110.BlockWidth;
  pvVar1->BlockHeight = local_110.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_120,"TEX_FORMAT_RG32_UINT",TEX_FORMAT_RG32_UINT,'\x04','\x02',
             COMPONENT_TYPE_UINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x11);
  pvVar1->Name = local_120.Name;
  pvVar1->Format = local_120.Format;
  pvVar1->ComponentSize = local_120.ComponentSize;
  pvVar1->NumComponents = local_120.NumComponents;
  pvVar1->ComponentType = local_120.ComponentType;
  pvVar1->IsTypeless = local_120.IsTypeless;
  pvVar1->BlockWidth = local_120.BlockWidth;
  pvVar1->BlockHeight = local_120.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_130,"TEX_FORMAT_RG32_SINT",TEX_FORMAT_RG32_SINT,'\x04','\x02',
             COMPONENT_TYPE_SINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x12);
  pvVar1->Name = local_130.Name;
  pvVar1->Format = local_130.Format;
  pvVar1->ComponentSize = local_130.ComponentSize;
  pvVar1->NumComponents = local_130.NumComponents;
  pvVar1->ComponentType = local_130.ComponentType;
  pvVar1->IsTypeless = local_130.IsTypeless;
  pvVar1->BlockWidth = local_130.BlockWidth;
  pvVar1->BlockHeight = local_130.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_140,"TEX_FORMAT_R32G8X24_TYPELESS",TEX_FORMAT_R32G8X24_TYPELESS,'\x04','\x02',
             COMPONENT_TYPE_DEPTH_STENCIL,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x13);
  pvVar1->Name = local_140.Name;
  pvVar1->Format = local_140.Format;
  pvVar1->ComponentSize = local_140.ComponentSize;
  pvVar1->NumComponents = local_140.NumComponents;
  pvVar1->ComponentType = local_140.ComponentType;
  pvVar1->IsTypeless = local_140.IsTypeless;
  pvVar1->BlockWidth = local_140.BlockWidth;
  pvVar1->BlockHeight = local_140.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_150,"TEX_FORMAT_D32_FLOAT_S8X24_UINT",TEX_FORMAT_D32_FLOAT_S8X24_UINT,'\x04',
             '\x02',COMPONENT_TYPE_DEPTH_STENCIL,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x14);
  pvVar1->Name = local_150.Name;
  pvVar1->Format = local_150.Format;
  pvVar1->ComponentSize = local_150.ComponentSize;
  pvVar1->NumComponents = local_150.NumComponents;
  pvVar1->ComponentType = local_150.ComponentType;
  pvVar1->IsTypeless = local_150.IsTypeless;
  pvVar1->BlockWidth = local_150.BlockWidth;
  pvVar1->BlockHeight = local_150.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_160,"TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS",TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,
             '\x04','\x02',COMPONENT_TYPE_DEPTH_STENCIL,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x15);
  pvVar1->Name = local_160.Name;
  pvVar1->Format = local_160.Format;
  pvVar1->ComponentSize = local_160.ComponentSize;
  pvVar1->NumComponents = local_160.NumComponents;
  pvVar1->ComponentType = local_160.ComponentType;
  pvVar1->IsTypeless = local_160.IsTypeless;
  pvVar1->BlockWidth = local_160.BlockWidth;
  pvVar1->BlockHeight = local_160.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_170,"TEX_FORMAT_X32_TYPELESS_G8X24_UINT",TEX_FORMAT_X32_TYPELESS_G8X24_UINT,
             '\x04','\x02',COMPONENT_TYPE_DEPTH_STENCIL,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x16);
  pvVar1->Name = local_170.Name;
  pvVar1->Format = local_170.Format;
  pvVar1->ComponentSize = local_170.ComponentSize;
  pvVar1->NumComponents = local_170.NumComponents;
  pvVar1->ComponentType = local_170.ComponentType;
  pvVar1->IsTypeless = local_170.IsTypeless;
  pvVar1->BlockWidth = local_170.BlockWidth;
  pvVar1->BlockHeight = local_170.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_180,"TEX_FORMAT_RGB10A2_TYPELESS",TEX_FORMAT_RGB10A2_TYPELESS,'\x04','\x01',
             COMPONENT_TYPE_COMPOUND,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x17);
  pvVar1->Name = local_180.Name;
  pvVar1->Format = local_180.Format;
  pvVar1->ComponentSize = local_180.ComponentSize;
  pvVar1->NumComponents = local_180.NumComponents;
  pvVar1->ComponentType = local_180.ComponentType;
  pvVar1->IsTypeless = local_180.IsTypeless;
  pvVar1->BlockWidth = local_180.BlockWidth;
  pvVar1->BlockHeight = local_180.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_190,"TEX_FORMAT_RGB10A2_UNORM",TEX_FORMAT_RGB10A2_UNORM,'\x04','\x01',
             COMPONENT_TYPE_COMPOUND,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x18);
  pvVar1->Name = local_190.Name;
  pvVar1->Format = local_190.Format;
  pvVar1->ComponentSize = local_190.ComponentSize;
  pvVar1->NumComponents = local_190.NumComponents;
  pvVar1->ComponentType = local_190.ComponentType;
  pvVar1->IsTypeless = local_190.IsTypeless;
  pvVar1->BlockWidth = local_190.BlockWidth;
  pvVar1->BlockHeight = local_190.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_1a0,"TEX_FORMAT_RGB10A2_UINT",TEX_FORMAT_RGB10A2_UINT,'\x04','\x01',
             COMPONENT_TYPE_COMPOUND,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x19);
  pvVar1->Name = local_1a0.Name;
  pvVar1->Format = local_1a0.Format;
  pvVar1->ComponentSize = local_1a0.ComponentSize;
  pvVar1->NumComponents = local_1a0.NumComponents;
  pvVar1->ComponentType = local_1a0.ComponentType;
  pvVar1->IsTypeless = local_1a0.IsTypeless;
  pvVar1->BlockWidth = local_1a0.BlockWidth;
  pvVar1->BlockHeight = local_1a0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_1b0,"TEX_FORMAT_R11G11B10_FLOAT",TEX_FORMAT_R11G11B10_FLOAT,'\x04','\x01',
             COMPONENT_TYPE_COMPOUND,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x1a);
  pvVar1->Name = local_1b0.Name;
  pvVar1->Format = local_1b0.Format;
  pvVar1->ComponentSize = local_1b0.ComponentSize;
  pvVar1->NumComponents = local_1b0.NumComponents;
  pvVar1->ComponentType = local_1b0.ComponentType;
  pvVar1->IsTypeless = local_1b0.IsTypeless;
  pvVar1->BlockWidth = local_1b0.BlockWidth;
  pvVar1->BlockHeight = local_1b0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_1c0,"TEX_FORMAT_RGBA8_TYPELESS",TEX_FORMAT_RGBA8_TYPELESS,'\x01','\x04',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x1b);
  pvVar1->Name = local_1c0.Name;
  pvVar1->Format = local_1c0.Format;
  pvVar1->ComponentSize = local_1c0.ComponentSize;
  pvVar1->NumComponents = local_1c0.NumComponents;
  pvVar1->ComponentType = local_1c0.ComponentType;
  pvVar1->IsTypeless = local_1c0.IsTypeless;
  pvVar1->BlockWidth = local_1c0.BlockWidth;
  pvVar1->BlockHeight = local_1c0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_1d0,"TEX_FORMAT_RGBA8_UNORM",TEX_FORMAT_RGBA8_UNORM,'\x01','\x04',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x1c);
  pvVar1->Name = local_1d0.Name;
  pvVar1->Format = local_1d0.Format;
  pvVar1->ComponentSize = local_1d0.ComponentSize;
  pvVar1->NumComponents = local_1d0.NumComponents;
  pvVar1->ComponentType = local_1d0.ComponentType;
  pvVar1->IsTypeless = local_1d0.IsTypeless;
  pvVar1->BlockWidth = local_1d0.BlockWidth;
  pvVar1->BlockHeight = local_1d0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_1e0,"TEX_FORMAT_RGBA8_UNORM_SRGB",TEX_FORMAT_RGBA8_UNORM_SRGB,'\x01','\x04',
             COMPONENT_TYPE_UNORM_SRGB,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x1d);
  pvVar1->Name = local_1e0.Name;
  pvVar1->Format = local_1e0.Format;
  pvVar1->ComponentSize = local_1e0.ComponentSize;
  pvVar1->NumComponents = local_1e0.NumComponents;
  pvVar1->ComponentType = local_1e0.ComponentType;
  pvVar1->IsTypeless = local_1e0.IsTypeless;
  pvVar1->BlockWidth = local_1e0.BlockWidth;
  pvVar1->BlockHeight = local_1e0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_1f0,"TEX_FORMAT_RGBA8_UINT",TEX_FORMAT_RGBA8_UINT,'\x01','\x04',
             COMPONENT_TYPE_UINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x1e);
  pvVar1->Name = local_1f0.Name;
  pvVar1->Format = local_1f0.Format;
  pvVar1->ComponentSize = local_1f0.ComponentSize;
  pvVar1->NumComponents = local_1f0.NumComponents;
  pvVar1->ComponentType = local_1f0.ComponentType;
  pvVar1->IsTypeless = local_1f0.IsTypeless;
  pvVar1->BlockWidth = local_1f0.BlockWidth;
  pvVar1->BlockHeight = local_1f0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_200,"TEX_FORMAT_RGBA8_SNORM",TEX_FORMAT_RGBA8_SNORM,'\x01','\x04',
             COMPONENT_TYPE_SNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x1f);
  pvVar1->Name = local_200.Name;
  pvVar1->Format = local_200.Format;
  pvVar1->ComponentSize = local_200.ComponentSize;
  pvVar1->NumComponents = local_200.NumComponents;
  pvVar1->ComponentType = local_200.ComponentType;
  pvVar1->IsTypeless = local_200.IsTypeless;
  pvVar1->BlockWidth = local_200.BlockWidth;
  pvVar1->BlockHeight = local_200.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_210,"TEX_FORMAT_RGBA8_SINT",TEX_FORMAT_RGBA8_SINT,'\x01','\x04',
             COMPONENT_TYPE_SINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x20);
  pvVar1->Name = local_210.Name;
  pvVar1->Format = local_210.Format;
  pvVar1->ComponentSize = local_210.ComponentSize;
  pvVar1->NumComponents = local_210.NumComponents;
  pvVar1->ComponentType = local_210.ComponentType;
  pvVar1->IsTypeless = local_210.IsTypeless;
  pvVar1->BlockWidth = local_210.BlockWidth;
  pvVar1->BlockHeight = local_210.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_220,"TEX_FORMAT_RG16_TYPELESS",TEX_FORMAT_RG16_TYPELESS,'\x02','\x02',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x21);
  pvVar1->Name = local_220.Name;
  pvVar1->Format = local_220.Format;
  pvVar1->ComponentSize = local_220.ComponentSize;
  pvVar1->NumComponents = local_220.NumComponents;
  pvVar1->ComponentType = local_220.ComponentType;
  pvVar1->IsTypeless = local_220.IsTypeless;
  pvVar1->BlockWidth = local_220.BlockWidth;
  pvVar1->BlockHeight = local_220.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_230,"TEX_FORMAT_RG16_FLOAT",TEX_FORMAT_RG16_FLOAT,'\x02','\x02',
             COMPONENT_TYPE_FLOAT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x22);
  pvVar1->Name = local_230.Name;
  pvVar1->Format = local_230.Format;
  pvVar1->ComponentSize = local_230.ComponentSize;
  pvVar1->NumComponents = local_230.NumComponents;
  pvVar1->ComponentType = local_230.ComponentType;
  pvVar1->IsTypeless = local_230.IsTypeless;
  pvVar1->BlockWidth = local_230.BlockWidth;
  pvVar1->BlockHeight = local_230.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_240,"TEX_FORMAT_RG16_UNORM",TEX_FORMAT_RG16_UNORM,'\x02','\x02',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x23);
  pvVar1->Name = local_240.Name;
  pvVar1->Format = local_240.Format;
  pvVar1->ComponentSize = local_240.ComponentSize;
  pvVar1->NumComponents = local_240.NumComponents;
  pvVar1->ComponentType = local_240.ComponentType;
  pvVar1->IsTypeless = local_240.IsTypeless;
  pvVar1->BlockWidth = local_240.BlockWidth;
  pvVar1->BlockHeight = local_240.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_250,"TEX_FORMAT_RG16_UINT",TEX_FORMAT_RG16_UINT,'\x02','\x02',
             COMPONENT_TYPE_UINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x24);
  pvVar1->Name = local_250.Name;
  pvVar1->Format = local_250.Format;
  pvVar1->ComponentSize = local_250.ComponentSize;
  pvVar1->NumComponents = local_250.NumComponents;
  pvVar1->ComponentType = local_250.ComponentType;
  pvVar1->IsTypeless = local_250.IsTypeless;
  pvVar1->BlockWidth = local_250.BlockWidth;
  pvVar1->BlockHeight = local_250.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_260,"TEX_FORMAT_RG16_SNORM",TEX_FORMAT_RG16_SNORM,'\x02','\x02',
             COMPONENT_TYPE_SNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x25);
  pvVar1->Name = local_260.Name;
  pvVar1->Format = local_260.Format;
  pvVar1->ComponentSize = local_260.ComponentSize;
  pvVar1->NumComponents = local_260.NumComponents;
  pvVar1->ComponentType = local_260.ComponentType;
  pvVar1->IsTypeless = local_260.IsTypeless;
  pvVar1->BlockWidth = local_260.BlockWidth;
  pvVar1->BlockHeight = local_260.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_270,"TEX_FORMAT_RG16_SINT",TEX_FORMAT_RG16_SINT,'\x02','\x02',
             COMPONENT_TYPE_SINT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x26);
  pvVar1->Name = local_270.Name;
  pvVar1->Format = local_270.Format;
  pvVar1->ComponentSize = local_270.ComponentSize;
  pvVar1->NumComponents = local_270.NumComponents;
  pvVar1->ComponentType = local_270.ComponentType;
  pvVar1->IsTypeless = local_270.IsTypeless;
  pvVar1->BlockWidth = local_270.BlockWidth;
  pvVar1->BlockHeight = local_270.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_280,"TEX_FORMAT_R32_TYPELESS",TEX_FORMAT_R32_TYPELESS,'\x04','\x01',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x27);
  pvVar1->Name = local_280.Name;
  pvVar1->Format = local_280.Format;
  pvVar1->ComponentSize = local_280.ComponentSize;
  pvVar1->NumComponents = local_280.NumComponents;
  pvVar1->ComponentType = local_280.ComponentType;
  pvVar1->IsTypeless = local_280.IsTypeless;
  pvVar1->BlockWidth = local_280.BlockWidth;
  pvVar1->BlockHeight = local_280.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_290,"TEX_FORMAT_D32_FLOAT",TEX_FORMAT_D32_FLOAT,'\x04','\x01',
             COMPONENT_TYPE_DEPTH,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x28);
  pvVar1->Name = local_290.Name;
  pvVar1->Format = local_290.Format;
  pvVar1->ComponentSize = local_290.ComponentSize;
  pvVar1->NumComponents = local_290.NumComponents;
  pvVar1->ComponentType = local_290.ComponentType;
  pvVar1->IsTypeless = local_290.IsTypeless;
  pvVar1->BlockWidth = local_290.BlockWidth;
  pvVar1->BlockHeight = local_290.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_2a0,"TEX_FORMAT_R32_FLOAT",TEX_FORMAT_R32_FLOAT,'\x04','\x01',
             COMPONENT_TYPE_FLOAT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x29);
  pvVar1->Name = local_2a0.Name;
  pvVar1->Format = local_2a0.Format;
  pvVar1->ComponentSize = local_2a0.ComponentSize;
  pvVar1->NumComponents = local_2a0.NumComponents;
  pvVar1->ComponentType = local_2a0.ComponentType;
  pvVar1->IsTypeless = local_2a0.IsTypeless;
  pvVar1->BlockWidth = local_2a0.BlockWidth;
  pvVar1->BlockHeight = local_2a0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_2b0,"TEX_FORMAT_R32_UINT",TEX_FORMAT_R32_UINT,'\x04','\x01',COMPONENT_TYPE_UINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x2a);
  pvVar1->Name = local_2b0.Name;
  pvVar1->Format = local_2b0.Format;
  pvVar1->ComponentSize = local_2b0.ComponentSize;
  pvVar1->NumComponents = local_2b0.NumComponents;
  pvVar1->ComponentType = local_2b0.ComponentType;
  pvVar1->IsTypeless = local_2b0.IsTypeless;
  pvVar1->BlockWidth = local_2b0.BlockWidth;
  pvVar1->BlockHeight = local_2b0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_2c0,"TEX_FORMAT_R32_SINT",TEX_FORMAT_R32_SINT,'\x04','\x01',COMPONENT_TYPE_SINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x2b);
  pvVar1->Name = local_2c0.Name;
  pvVar1->Format = local_2c0.Format;
  pvVar1->ComponentSize = local_2c0.ComponentSize;
  pvVar1->NumComponents = local_2c0.NumComponents;
  pvVar1->ComponentType = local_2c0.ComponentType;
  pvVar1->IsTypeless = local_2c0.IsTypeless;
  pvVar1->BlockWidth = local_2c0.BlockWidth;
  pvVar1->BlockHeight = local_2c0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_2d0,"TEX_FORMAT_R24G8_TYPELESS",TEX_FORMAT_R24G8_TYPELESS,'\x04','\x01',
             COMPONENT_TYPE_DEPTH_STENCIL,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x2c);
  pvVar1->Name = local_2d0.Name;
  pvVar1->Format = local_2d0.Format;
  pvVar1->ComponentSize = local_2d0.ComponentSize;
  pvVar1->NumComponents = local_2d0.NumComponents;
  pvVar1->ComponentType = local_2d0.ComponentType;
  pvVar1->IsTypeless = local_2d0.IsTypeless;
  pvVar1->BlockWidth = local_2d0.BlockWidth;
  pvVar1->BlockHeight = local_2d0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_2e0,"TEX_FORMAT_D24_UNORM_S8_UINT",TEX_FORMAT_D24_UNORM_S8_UINT,'\x04','\x01',
             COMPONENT_TYPE_DEPTH_STENCIL,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x2d);
  pvVar1->Name = local_2e0.Name;
  pvVar1->Format = local_2e0.Format;
  pvVar1->ComponentSize = local_2e0.ComponentSize;
  pvVar1->NumComponents = local_2e0.NumComponents;
  pvVar1->ComponentType = local_2e0.ComponentType;
  pvVar1->IsTypeless = local_2e0.IsTypeless;
  pvVar1->BlockWidth = local_2e0.BlockWidth;
  pvVar1->BlockHeight = local_2e0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_2f0,"TEX_FORMAT_R24_UNORM_X8_TYPELESS",TEX_FORMAT_R24_UNORM_X8_TYPELESS,'\x04',
             '\x01',COMPONENT_TYPE_DEPTH_STENCIL,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x2e);
  pvVar1->Name = local_2f0.Name;
  pvVar1->Format = local_2f0.Format;
  pvVar1->ComponentSize = local_2f0.ComponentSize;
  pvVar1->NumComponents = local_2f0.NumComponents;
  pvVar1->ComponentType = local_2f0.ComponentType;
  pvVar1->IsTypeless = local_2f0.IsTypeless;
  pvVar1->BlockWidth = local_2f0.BlockWidth;
  pvVar1->BlockHeight = local_2f0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_300,"TEX_FORMAT_X24_TYPELESS_G8_UINT",TEX_FORMAT_X24_TYPELESS_G8_UINT,'\x04',
             '\x01',COMPONENT_TYPE_DEPTH_STENCIL,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x2f);
  pvVar1->Name = local_300.Name;
  pvVar1->Format = local_300.Format;
  pvVar1->ComponentSize = local_300.ComponentSize;
  pvVar1->NumComponents = local_300.NumComponents;
  pvVar1->ComponentType = local_300.ComponentType;
  pvVar1->IsTypeless = local_300.IsTypeless;
  pvVar1->BlockWidth = local_300.BlockWidth;
  pvVar1->BlockHeight = local_300.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_310,"TEX_FORMAT_RG8_TYPELESS",TEX_FORMAT_RG8_TYPELESS,'\x01','\x02',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x30);
  pvVar1->Name = local_310.Name;
  pvVar1->Format = local_310.Format;
  pvVar1->ComponentSize = local_310.ComponentSize;
  pvVar1->NumComponents = local_310.NumComponents;
  pvVar1->ComponentType = local_310.ComponentType;
  pvVar1->IsTypeless = local_310.IsTypeless;
  pvVar1->BlockWidth = local_310.BlockWidth;
  pvVar1->BlockHeight = local_310.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_320,"TEX_FORMAT_RG8_UNORM",TEX_FORMAT_RG8_UNORM,'\x01','\x02',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x31);
  pvVar1->Name = local_320.Name;
  pvVar1->Format = local_320.Format;
  pvVar1->ComponentSize = local_320.ComponentSize;
  pvVar1->NumComponents = local_320.NumComponents;
  pvVar1->ComponentType = local_320.ComponentType;
  pvVar1->IsTypeless = local_320.IsTypeless;
  pvVar1->BlockWidth = local_320.BlockWidth;
  pvVar1->BlockHeight = local_320.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_330,"TEX_FORMAT_RG8_UINT",TEX_FORMAT_RG8_UINT,'\x01','\x02',COMPONENT_TYPE_UINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x32);
  pvVar1->Name = local_330.Name;
  pvVar1->Format = local_330.Format;
  pvVar1->ComponentSize = local_330.ComponentSize;
  pvVar1->NumComponents = local_330.NumComponents;
  pvVar1->ComponentType = local_330.ComponentType;
  pvVar1->IsTypeless = local_330.IsTypeless;
  pvVar1->BlockWidth = local_330.BlockWidth;
  pvVar1->BlockHeight = local_330.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_340,"TEX_FORMAT_RG8_SNORM",TEX_FORMAT_RG8_SNORM,'\x01','\x02',
             COMPONENT_TYPE_SNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x33);
  pvVar1->Name = local_340.Name;
  pvVar1->Format = local_340.Format;
  pvVar1->ComponentSize = local_340.ComponentSize;
  pvVar1->NumComponents = local_340.NumComponents;
  pvVar1->ComponentType = local_340.ComponentType;
  pvVar1->IsTypeless = local_340.IsTypeless;
  pvVar1->BlockWidth = local_340.BlockWidth;
  pvVar1->BlockHeight = local_340.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_350,"TEX_FORMAT_RG8_SINT",TEX_FORMAT_RG8_SINT,'\x01','\x02',COMPONENT_TYPE_SINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x34);
  pvVar1->Name = local_350.Name;
  pvVar1->Format = local_350.Format;
  pvVar1->ComponentSize = local_350.ComponentSize;
  pvVar1->NumComponents = local_350.NumComponents;
  pvVar1->ComponentType = local_350.ComponentType;
  pvVar1->IsTypeless = local_350.IsTypeless;
  pvVar1->BlockWidth = local_350.BlockWidth;
  pvVar1->BlockHeight = local_350.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_360,"TEX_FORMAT_R16_TYPELESS",TEX_FORMAT_R16_TYPELESS,'\x02','\x01',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x35);
  pvVar1->Name = local_360.Name;
  pvVar1->Format = local_360.Format;
  pvVar1->ComponentSize = local_360.ComponentSize;
  pvVar1->NumComponents = local_360.NumComponents;
  pvVar1->ComponentType = local_360.ComponentType;
  pvVar1->IsTypeless = local_360.IsTypeless;
  pvVar1->BlockWidth = local_360.BlockWidth;
  pvVar1->BlockHeight = local_360.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_370,"TEX_FORMAT_R16_FLOAT",TEX_FORMAT_R16_FLOAT,'\x02','\x01',
             COMPONENT_TYPE_FLOAT,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x36);
  pvVar1->Name = local_370.Name;
  pvVar1->Format = local_370.Format;
  pvVar1->ComponentSize = local_370.ComponentSize;
  pvVar1->NumComponents = local_370.NumComponents;
  pvVar1->ComponentType = local_370.ComponentType;
  pvVar1->IsTypeless = local_370.IsTypeless;
  pvVar1->BlockWidth = local_370.BlockWidth;
  pvVar1->BlockHeight = local_370.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_380,"TEX_FORMAT_D16_UNORM",TEX_FORMAT_D16_UNORM,'\x02','\x01',
             COMPONENT_TYPE_DEPTH,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x37);
  pvVar1->Name = local_380.Name;
  pvVar1->Format = local_380.Format;
  pvVar1->ComponentSize = local_380.ComponentSize;
  pvVar1->NumComponents = local_380.NumComponents;
  pvVar1->ComponentType = local_380.ComponentType;
  pvVar1->IsTypeless = local_380.IsTypeless;
  pvVar1->BlockWidth = local_380.BlockWidth;
  pvVar1->BlockHeight = local_380.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_390,"TEX_FORMAT_R16_UNORM",TEX_FORMAT_R16_UNORM,'\x02','\x01',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x38);
  pvVar1->Name = local_390.Name;
  pvVar1->Format = local_390.Format;
  pvVar1->ComponentSize = local_390.ComponentSize;
  pvVar1->NumComponents = local_390.NumComponents;
  pvVar1->ComponentType = local_390.ComponentType;
  pvVar1->IsTypeless = local_390.IsTypeless;
  pvVar1->BlockWidth = local_390.BlockWidth;
  pvVar1->BlockHeight = local_390.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_3a0,"TEX_FORMAT_R16_UINT",TEX_FORMAT_R16_UINT,'\x02','\x01',COMPONENT_TYPE_UINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x39);
  pvVar1->Name = local_3a0.Name;
  pvVar1->Format = local_3a0.Format;
  pvVar1->ComponentSize = local_3a0.ComponentSize;
  pvVar1->NumComponents = local_3a0.NumComponents;
  pvVar1->ComponentType = local_3a0.ComponentType;
  pvVar1->IsTypeless = local_3a0.IsTypeless;
  pvVar1->BlockWidth = local_3a0.BlockWidth;
  pvVar1->BlockHeight = local_3a0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_3b0,"TEX_FORMAT_R16_SNORM",TEX_FORMAT_R16_SNORM,'\x02','\x01',
             COMPONENT_TYPE_SNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x3a);
  pvVar1->Name = local_3b0.Name;
  pvVar1->Format = local_3b0.Format;
  pvVar1->ComponentSize = local_3b0.ComponentSize;
  pvVar1->NumComponents = local_3b0.NumComponents;
  pvVar1->ComponentType = local_3b0.ComponentType;
  pvVar1->IsTypeless = local_3b0.IsTypeless;
  pvVar1->BlockWidth = local_3b0.BlockWidth;
  pvVar1->BlockHeight = local_3b0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_3c0,"TEX_FORMAT_R16_SINT",TEX_FORMAT_R16_SINT,'\x02','\x01',COMPONENT_TYPE_SINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x3b);
  pvVar1->Name = local_3c0.Name;
  pvVar1->Format = local_3c0.Format;
  pvVar1->ComponentSize = local_3c0.ComponentSize;
  pvVar1->NumComponents = local_3c0.NumComponents;
  pvVar1->ComponentType = local_3c0.ComponentType;
  pvVar1->IsTypeless = local_3c0.IsTypeless;
  pvVar1->BlockWidth = local_3c0.BlockWidth;
  pvVar1->BlockHeight = local_3c0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_3d0,"TEX_FORMAT_R8_TYPELESS",TEX_FORMAT_R8_TYPELESS,'\x01','\x01',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x3c);
  pvVar1->Name = local_3d0.Name;
  pvVar1->Format = local_3d0.Format;
  pvVar1->ComponentSize = local_3d0.ComponentSize;
  pvVar1->NumComponents = local_3d0.NumComponents;
  pvVar1->ComponentType = local_3d0.ComponentType;
  pvVar1->IsTypeless = local_3d0.IsTypeless;
  pvVar1->BlockWidth = local_3d0.BlockWidth;
  pvVar1->BlockHeight = local_3d0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_3e0,"TEX_FORMAT_R8_UNORM",TEX_FORMAT_R8_UNORM,'\x01','\x01',COMPONENT_TYPE_UNORM
             ,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x3d);
  pvVar1->Name = local_3e0.Name;
  pvVar1->Format = local_3e0.Format;
  pvVar1->ComponentSize = local_3e0.ComponentSize;
  pvVar1->NumComponents = local_3e0.NumComponents;
  pvVar1->ComponentType = local_3e0.ComponentType;
  pvVar1->IsTypeless = local_3e0.IsTypeless;
  pvVar1->BlockWidth = local_3e0.BlockWidth;
  pvVar1->BlockHeight = local_3e0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_3f0,"TEX_FORMAT_R8_UINT",TEX_FORMAT_R8_UINT,'\x01','\x01',COMPONENT_TYPE_UINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x3e);
  pvVar1->Name = local_3f0.Name;
  pvVar1->Format = local_3f0.Format;
  pvVar1->ComponentSize = local_3f0.ComponentSize;
  pvVar1->NumComponents = local_3f0.NumComponents;
  pvVar1->ComponentType = local_3f0.ComponentType;
  pvVar1->IsTypeless = local_3f0.IsTypeless;
  pvVar1->BlockWidth = local_3f0.BlockWidth;
  pvVar1->BlockHeight = local_3f0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_400,"TEX_FORMAT_R8_SNORM",TEX_FORMAT_R8_SNORM,'\x01','\x01',COMPONENT_TYPE_SNORM
             ,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x3f);
  pvVar1->Name = local_400.Name;
  pvVar1->Format = local_400.Format;
  pvVar1->ComponentSize = local_400.ComponentSize;
  pvVar1->NumComponents = local_400.NumComponents;
  pvVar1->ComponentType = local_400.ComponentType;
  pvVar1->IsTypeless = local_400.IsTypeless;
  pvVar1->BlockWidth = local_400.BlockWidth;
  pvVar1->BlockHeight = local_400.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_410,"TEX_FORMAT_R8_SINT",TEX_FORMAT_R8_SINT,'\x01','\x01',COMPONENT_TYPE_SINT,
             false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x40);
  pvVar1->Name = local_410.Name;
  pvVar1->Format = local_410.Format;
  pvVar1->ComponentSize = local_410.ComponentSize;
  pvVar1->NumComponents = local_410.NumComponents;
  pvVar1->ComponentType = local_410.ComponentType;
  pvVar1->IsTypeless = local_410.IsTypeless;
  pvVar1->BlockWidth = local_410.BlockWidth;
  pvVar1->BlockHeight = local_410.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_420,"TEX_FORMAT_A8_UNORM",TEX_FORMAT_A8_UNORM,'\x01','\x01',COMPONENT_TYPE_UNORM
             ,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x41);
  pvVar1->Name = local_420.Name;
  pvVar1->Format = local_420.Format;
  pvVar1->ComponentSize = local_420.ComponentSize;
  pvVar1->NumComponents = local_420.NumComponents;
  pvVar1->ComponentType = local_420.ComponentType;
  pvVar1->IsTypeless = local_420.IsTypeless;
  pvVar1->BlockWidth = local_420.BlockWidth;
  pvVar1->BlockHeight = local_420.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_430,"TEX_FORMAT_R1_UNORM",TEX_FORMAT_R1_UNORM,'\x01','\x01',COMPONENT_TYPE_UNORM
             ,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x42);
  pvVar1->Name = local_430.Name;
  pvVar1->Format = local_430.Format;
  pvVar1->ComponentSize = local_430.ComponentSize;
  pvVar1->NumComponents = local_430.NumComponents;
  pvVar1->ComponentType = local_430.ComponentType;
  pvVar1->IsTypeless = local_430.IsTypeless;
  pvVar1->BlockWidth = local_430.BlockWidth;
  pvVar1->BlockHeight = local_430.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_440,"TEX_FORMAT_RGB9E5_SHAREDEXP",TEX_FORMAT_RGB9E5_SHAREDEXP,'\x04','\x01',
             COMPONENT_TYPE_COMPOUND,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x43);
  pvVar1->Name = local_440.Name;
  pvVar1->Format = local_440.Format;
  pvVar1->ComponentSize = local_440.ComponentSize;
  pvVar1->NumComponents = local_440.NumComponents;
  pvVar1->ComponentType = local_440.ComponentType;
  pvVar1->IsTypeless = local_440.IsTypeless;
  pvVar1->BlockWidth = local_440.BlockWidth;
  pvVar1->BlockHeight = local_440.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_450,"TEX_FORMAT_RG8_B8G8_UNORM",TEX_FORMAT_RG8_B8G8_UNORM,'\x01','\x04',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x44);
  pvVar1->Name = local_450.Name;
  pvVar1->Format = local_450.Format;
  pvVar1->ComponentSize = local_450.ComponentSize;
  pvVar1->NumComponents = local_450.NumComponents;
  pvVar1->ComponentType = local_450.ComponentType;
  pvVar1->IsTypeless = local_450.IsTypeless;
  pvVar1->BlockWidth = local_450.BlockWidth;
  pvVar1->BlockHeight = local_450.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_460,"TEX_FORMAT_G8R8_G8B8_UNORM",TEX_FORMAT_G8R8_G8B8_UNORM,'\x01','\x04',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x45);
  pvVar1->Name = local_460.Name;
  pvVar1->Format = local_460.Format;
  pvVar1->ComponentSize = local_460.ComponentSize;
  pvVar1->NumComponents = local_460.NumComponents;
  pvVar1->ComponentType = local_460.ComponentType;
  pvVar1->IsTypeless = local_460.IsTypeless;
  pvVar1->BlockWidth = local_460.BlockWidth;
  pvVar1->BlockHeight = local_460.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_470,"TEX_FORMAT_BC1_TYPELESS",TEX_FORMAT_BC1_TYPELESS,'\b','\x03',
             COMPONENT_TYPE_COMPRESSED,true,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x46);
  pvVar1->Name = local_470.Name;
  pvVar1->Format = local_470.Format;
  pvVar1->ComponentSize = local_470.ComponentSize;
  pvVar1->NumComponents = local_470.NumComponents;
  pvVar1->ComponentType = local_470.ComponentType;
  pvVar1->IsTypeless = local_470.IsTypeless;
  pvVar1->BlockWidth = local_470.BlockWidth;
  pvVar1->BlockHeight = local_470.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_480,"TEX_FORMAT_BC1_UNORM",TEX_FORMAT_BC1_UNORM,'\b','\x03',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x47);
  pvVar1->Name = local_480.Name;
  pvVar1->Format = local_480.Format;
  pvVar1->ComponentSize = local_480.ComponentSize;
  pvVar1->NumComponents = local_480.NumComponents;
  pvVar1->ComponentType = local_480.ComponentType;
  pvVar1->IsTypeless = local_480.IsTypeless;
  pvVar1->BlockWidth = local_480.BlockWidth;
  pvVar1->BlockHeight = local_480.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_490,"TEX_FORMAT_BC1_UNORM_SRGB",TEX_FORMAT_BC1_UNORM_SRGB,'\b','\x03',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x48);
  pvVar1->Name = local_490.Name;
  pvVar1->Format = local_490.Format;
  pvVar1->ComponentSize = local_490.ComponentSize;
  pvVar1->NumComponents = local_490.NumComponents;
  pvVar1->ComponentType = local_490.ComponentType;
  pvVar1->IsTypeless = local_490.IsTypeless;
  pvVar1->BlockWidth = local_490.BlockWidth;
  pvVar1->BlockHeight = local_490.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_4a0,"TEX_FORMAT_BC2_TYPELESS",TEX_FORMAT_BC2_TYPELESS,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,true,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x49);
  pvVar1->Name = local_4a0.Name;
  pvVar1->Format = local_4a0.Format;
  pvVar1->ComponentSize = local_4a0.ComponentSize;
  pvVar1->NumComponents = local_4a0.NumComponents;
  pvVar1->ComponentType = local_4a0.ComponentType;
  pvVar1->IsTypeless = local_4a0.IsTypeless;
  pvVar1->BlockWidth = local_4a0.BlockWidth;
  pvVar1->BlockHeight = local_4a0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_4b0,"TEX_FORMAT_BC2_UNORM",TEX_FORMAT_BC2_UNORM,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x4a);
  pvVar1->Name = local_4b0.Name;
  pvVar1->Format = local_4b0.Format;
  pvVar1->ComponentSize = local_4b0.ComponentSize;
  pvVar1->NumComponents = local_4b0.NumComponents;
  pvVar1->ComponentType = local_4b0.ComponentType;
  pvVar1->IsTypeless = local_4b0.IsTypeless;
  pvVar1->BlockWidth = local_4b0.BlockWidth;
  pvVar1->BlockHeight = local_4b0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_4c0,"TEX_FORMAT_BC2_UNORM_SRGB",TEX_FORMAT_BC2_UNORM_SRGB,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x4b);
  pvVar1->Name = local_4c0.Name;
  pvVar1->Format = local_4c0.Format;
  pvVar1->ComponentSize = local_4c0.ComponentSize;
  pvVar1->NumComponents = local_4c0.NumComponents;
  pvVar1->ComponentType = local_4c0.ComponentType;
  pvVar1->IsTypeless = local_4c0.IsTypeless;
  pvVar1->BlockWidth = local_4c0.BlockWidth;
  pvVar1->BlockHeight = local_4c0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_4d0,"TEX_FORMAT_BC3_TYPELESS",TEX_FORMAT_BC3_TYPELESS,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,true,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x4c);
  pvVar1->Name = local_4d0.Name;
  pvVar1->Format = local_4d0.Format;
  pvVar1->ComponentSize = local_4d0.ComponentSize;
  pvVar1->NumComponents = local_4d0.NumComponents;
  pvVar1->ComponentType = local_4d0.ComponentType;
  pvVar1->IsTypeless = local_4d0.IsTypeless;
  pvVar1->BlockWidth = local_4d0.BlockWidth;
  pvVar1->BlockHeight = local_4d0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_4e0,"TEX_FORMAT_BC3_UNORM",TEX_FORMAT_BC3_UNORM,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x4d);
  pvVar1->Name = local_4e0.Name;
  pvVar1->Format = local_4e0.Format;
  pvVar1->ComponentSize = local_4e0.ComponentSize;
  pvVar1->NumComponents = local_4e0.NumComponents;
  pvVar1->ComponentType = local_4e0.ComponentType;
  pvVar1->IsTypeless = local_4e0.IsTypeless;
  pvVar1->BlockWidth = local_4e0.BlockWidth;
  pvVar1->BlockHeight = local_4e0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_4f0,"TEX_FORMAT_BC3_UNORM_SRGB",TEX_FORMAT_BC3_UNORM_SRGB,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x4e);
  pvVar1->Name = local_4f0.Name;
  pvVar1->Format = local_4f0.Format;
  pvVar1->ComponentSize = local_4f0.ComponentSize;
  pvVar1->NumComponents = local_4f0.NumComponents;
  pvVar1->ComponentType = local_4f0.ComponentType;
  pvVar1->IsTypeless = local_4f0.IsTypeless;
  pvVar1->BlockWidth = local_4f0.BlockWidth;
  pvVar1->BlockHeight = local_4f0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_500,"TEX_FORMAT_BC4_TYPELESS",TEX_FORMAT_BC4_TYPELESS,'\b','\x01',
             COMPONENT_TYPE_COMPRESSED,true,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x4f);
  pvVar1->Name = local_500.Name;
  pvVar1->Format = local_500.Format;
  pvVar1->ComponentSize = local_500.ComponentSize;
  pvVar1->NumComponents = local_500.NumComponents;
  pvVar1->ComponentType = local_500.ComponentType;
  pvVar1->IsTypeless = local_500.IsTypeless;
  pvVar1->BlockWidth = local_500.BlockWidth;
  pvVar1->BlockHeight = local_500.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_510,"TEX_FORMAT_BC4_UNORM",TEX_FORMAT_BC4_UNORM,'\b','\x01',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x50);
  pvVar1->Name = local_510.Name;
  pvVar1->Format = local_510.Format;
  pvVar1->ComponentSize = local_510.ComponentSize;
  pvVar1->NumComponents = local_510.NumComponents;
  pvVar1->ComponentType = local_510.ComponentType;
  pvVar1->IsTypeless = local_510.IsTypeless;
  pvVar1->BlockWidth = local_510.BlockWidth;
  pvVar1->BlockHeight = local_510.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_520,"TEX_FORMAT_BC4_SNORM",TEX_FORMAT_BC4_SNORM,'\b','\x01',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x51);
  pvVar1->Name = local_520.Name;
  pvVar1->Format = local_520.Format;
  pvVar1->ComponentSize = local_520.ComponentSize;
  pvVar1->NumComponents = local_520.NumComponents;
  pvVar1->ComponentType = local_520.ComponentType;
  pvVar1->IsTypeless = local_520.IsTypeless;
  pvVar1->BlockWidth = local_520.BlockWidth;
  pvVar1->BlockHeight = local_520.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_530,"TEX_FORMAT_BC5_TYPELESS",TEX_FORMAT_BC5_TYPELESS,'\x10','\x02',
             COMPONENT_TYPE_COMPRESSED,true,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x52);
  pvVar1->Name = local_530.Name;
  pvVar1->Format = local_530.Format;
  pvVar1->ComponentSize = local_530.ComponentSize;
  pvVar1->NumComponents = local_530.NumComponents;
  pvVar1->ComponentType = local_530.ComponentType;
  pvVar1->IsTypeless = local_530.IsTypeless;
  pvVar1->BlockWidth = local_530.BlockWidth;
  pvVar1->BlockHeight = local_530.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_540,"TEX_FORMAT_BC5_UNORM",TEX_FORMAT_BC5_UNORM,'\x10','\x02',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x53);
  pvVar1->Name = local_540.Name;
  pvVar1->Format = local_540.Format;
  pvVar1->ComponentSize = local_540.ComponentSize;
  pvVar1->NumComponents = local_540.NumComponents;
  pvVar1->ComponentType = local_540.ComponentType;
  pvVar1->IsTypeless = local_540.IsTypeless;
  pvVar1->BlockWidth = local_540.BlockWidth;
  pvVar1->BlockHeight = local_540.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_550,"TEX_FORMAT_BC5_SNORM",TEX_FORMAT_BC5_SNORM,'\x10','\x02',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x54);
  pvVar1->Name = local_550.Name;
  pvVar1->Format = local_550.Format;
  pvVar1->ComponentSize = local_550.ComponentSize;
  pvVar1->NumComponents = local_550.NumComponents;
  pvVar1->ComponentType = local_550.ComponentType;
  pvVar1->IsTypeless = local_550.IsTypeless;
  pvVar1->BlockWidth = local_550.BlockWidth;
  pvVar1->BlockHeight = local_550.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_560,"TEX_FORMAT_B5G6R5_UNORM",TEX_FORMAT_B5G6R5_UNORM,'\x02','\x01',
             COMPONENT_TYPE_COMPOUND,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x55);
  pvVar1->Name = local_560.Name;
  pvVar1->Format = local_560.Format;
  pvVar1->ComponentSize = local_560.ComponentSize;
  pvVar1->NumComponents = local_560.NumComponents;
  pvVar1->ComponentType = local_560.ComponentType;
  pvVar1->IsTypeless = local_560.IsTypeless;
  pvVar1->BlockWidth = local_560.BlockWidth;
  pvVar1->BlockHeight = local_560.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_570,"TEX_FORMAT_B5G5R5A1_UNORM",TEX_FORMAT_B5G5R5A1_UNORM,'\x02','\x01',
             COMPONENT_TYPE_COMPOUND,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x56);
  pvVar1->Name = local_570.Name;
  pvVar1->Format = local_570.Format;
  pvVar1->ComponentSize = local_570.ComponentSize;
  pvVar1->NumComponents = local_570.NumComponents;
  pvVar1->ComponentType = local_570.ComponentType;
  pvVar1->IsTypeless = local_570.IsTypeless;
  pvVar1->BlockWidth = local_570.BlockWidth;
  pvVar1->BlockHeight = local_570.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_580,"TEX_FORMAT_BGRA8_UNORM",TEX_FORMAT_BGRA8_UNORM,'\x01','\x04',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x57);
  pvVar1->Name = local_580.Name;
  pvVar1->Format = local_580.Format;
  pvVar1->ComponentSize = local_580.ComponentSize;
  pvVar1->NumComponents = local_580.NumComponents;
  pvVar1->ComponentType = local_580.ComponentType;
  pvVar1->IsTypeless = local_580.IsTypeless;
  pvVar1->BlockWidth = local_580.BlockWidth;
  pvVar1->BlockHeight = local_580.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_590,"TEX_FORMAT_BGRX8_UNORM",TEX_FORMAT_BGRX8_UNORM,'\x01','\x04',
             COMPONENT_TYPE_UNORM,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x58);
  pvVar1->Name = local_590.Name;
  pvVar1->Format = local_590.Format;
  pvVar1->ComponentSize = local_590.ComponentSize;
  pvVar1->NumComponents = local_590.NumComponents;
  pvVar1->ComponentType = local_590.ComponentType;
  pvVar1->IsTypeless = local_590.IsTypeless;
  pvVar1->BlockWidth = local_590.BlockWidth;
  pvVar1->BlockHeight = local_590.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_5a0,"TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM",
             TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM,'\x04','\x01',COMPONENT_TYPE_COMPOUND,false,
             '\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x59);
  pvVar1->Name = local_5a0.Name;
  pvVar1->Format = local_5a0.Format;
  pvVar1->ComponentSize = local_5a0.ComponentSize;
  pvVar1->NumComponents = local_5a0.NumComponents;
  pvVar1->ComponentType = local_5a0.ComponentType;
  pvVar1->IsTypeless = local_5a0.IsTypeless;
  pvVar1->BlockWidth = local_5a0.BlockWidth;
  pvVar1->BlockHeight = local_5a0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_5b0,"TEX_FORMAT_BGRA8_TYPELESS",TEX_FORMAT_BGRA8_TYPELESS,'\x01','\x04',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x5a);
  pvVar1->Name = local_5b0.Name;
  pvVar1->Format = local_5b0.Format;
  pvVar1->ComponentSize = local_5b0.ComponentSize;
  pvVar1->NumComponents = local_5b0.NumComponents;
  pvVar1->ComponentType = local_5b0.ComponentType;
  pvVar1->IsTypeless = local_5b0.IsTypeless;
  pvVar1->BlockWidth = local_5b0.BlockWidth;
  pvVar1->BlockHeight = local_5b0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_5c0,"TEX_FORMAT_BGRA8_UNORM_SRGB",TEX_FORMAT_BGRA8_UNORM_SRGB,'\x01','\x04',
             COMPONENT_TYPE_UNORM_SRGB,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x5b);
  pvVar1->Name = local_5c0.Name;
  pvVar1->Format = local_5c0.Format;
  pvVar1->ComponentSize = local_5c0.ComponentSize;
  pvVar1->NumComponents = local_5c0.NumComponents;
  pvVar1->ComponentType = local_5c0.ComponentType;
  pvVar1->IsTypeless = local_5c0.IsTypeless;
  pvVar1->BlockWidth = local_5c0.BlockWidth;
  pvVar1->BlockHeight = local_5c0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_5d0,"TEX_FORMAT_BGRX8_TYPELESS",TEX_FORMAT_BGRX8_TYPELESS,'\x01','\x04',
             COMPONENT_TYPE_UNDEFINED,true,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x5c);
  pvVar1->Name = local_5d0.Name;
  pvVar1->Format = local_5d0.Format;
  pvVar1->ComponentSize = local_5d0.ComponentSize;
  pvVar1->NumComponents = local_5d0.NumComponents;
  pvVar1->ComponentType = local_5d0.ComponentType;
  pvVar1->IsTypeless = local_5d0.IsTypeless;
  pvVar1->BlockWidth = local_5d0.BlockWidth;
  pvVar1->BlockHeight = local_5d0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_5e0,"TEX_FORMAT_BGRX8_UNORM_SRGB",TEX_FORMAT_BGRX8_UNORM_SRGB,'\x01','\x04',
             COMPONENT_TYPE_UNORM_SRGB,false,'\x01','\x01');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x5d);
  pvVar1->Name = local_5e0.Name;
  pvVar1->Format = local_5e0.Format;
  pvVar1->ComponentSize = local_5e0.ComponentSize;
  pvVar1->NumComponents = local_5e0.NumComponents;
  pvVar1->ComponentType = local_5e0.ComponentType;
  pvVar1->IsTypeless = local_5e0.IsTypeless;
  pvVar1->BlockWidth = local_5e0.BlockWidth;
  pvVar1->BlockHeight = local_5e0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_5f0,"TEX_FORMAT_BC6H_TYPELESS",TEX_FORMAT_BC6H_TYPELESS,'\x10','\x03',
             COMPONENT_TYPE_COMPRESSED,true,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x5e);
  pvVar1->Name = local_5f0.Name;
  pvVar1->Format = local_5f0.Format;
  pvVar1->ComponentSize = local_5f0.ComponentSize;
  pvVar1->NumComponents = local_5f0.NumComponents;
  pvVar1->ComponentType = local_5f0.ComponentType;
  pvVar1->IsTypeless = local_5f0.IsTypeless;
  pvVar1->BlockWidth = local_5f0.BlockWidth;
  pvVar1->BlockHeight = local_5f0.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_600,"TEX_FORMAT_BC6H_UF16",TEX_FORMAT_BC6H_UF16,'\x10','\x03',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x5f);
  pvVar1->Name = local_600.Name;
  pvVar1->Format = local_600.Format;
  pvVar1->ComponentSize = local_600.ComponentSize;
  pvVar1->NumComponents = local_600.NumComponents;
  pvVar1->ComponentType = local_600.ComponentType;
  pvVar1->IsTypeless = local_600.IsTypeless;
  pvVar1->BlockWidth = local_600.BlockWidth;
  pvVar1->BlockHeight = local_600.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_610,"TEX_FORMAT_BC6H_SF16",TEX_FORMAT_BC6H_SF16,'\x10','\x03',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x60);
  pvVar1->Name = local_610.Name;
  pvVar1->Format = local_610.Format;
  pvVar1->ComponentSize = local_610.ComponentSize;
  pvVar1->NumComponents = local_610.NumComponents;
  pvVar1->ComponentType = local_610.ComponentType;
  pvVar1->IsTypeless = local_610.IsTypeless;
  pvVar1->BlockWidth = local_610.BlockWidth;
  pvVar1->BlockHeight = local_610.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_620,"TEX_FORMAT_BC7_TYPELESS",TEX_FORMAT_BC7_TYPELESS,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,true,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x61);
  pvVar1->Name = local_620.Name;
  pvVar1->Format = local_620.Format;
  pvVar1->ComponentSize = local_620.ComponentSize;
  pvVar1->NumComponents = local_620.NumComponents;
  pvVar1->ComponentType = local_620.ComponentType;
  pvVar1->IsTypeless = local_620.IsTypeless;
  pvVar1->BlockWidth = local_620.BlockWidth;
  pvVar1->BlockHeight = local_620.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_630,"TEX_FORMAT_BC7_UNORM",TEX_FORMAT_BC7_UNORM,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x62);
  pvVar1->Name = local_630.Name;
  pvVar1->Format = local_630.Format;
  pvVar1->ComponentSize = local_630.ComponentSize;
  pvVar1->NumComponents = local_630.NumComponents;
  pvVar1->ComponentType = local_630.ComponentType;
  pvVar1->IsTypeless = local_630.IsTypeless;
  pvVar1->BlockWidth = local_630.BlockWidth;
  pvVar1->BlockHeight = local_630.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_640,"TEX_FORMAT_BC7_UNORM_SRGB",TEX_FORMAT_BC7_UNORM_SRGB,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,99);
  pvVar1->Name = local_640.Name;
  pvVar1->Format = local_640.Format;
  pvVar1->ComponentSize = local_640.ComponentSize;
  pvVar1->NumComponents = local_640.NumComponents;
  pvVar1->ComponentType = local_640.ComponentType;
  pvVar1->IsTypeless = local_640.IsTypeless;
  pvVar1->BlockWidth = local_640.BlockWidth;
  pvVar1->BlockHeight = local_640.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_650,"TEX_FORMAT_ETC2_RGB8_UNORM",TEX_FORMAT_ETC2_RGB8_UNORM,'\b','\x03',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,100);
  pvVar1->Name = local_650.Name;
  pvVar1->Format = local_650.Format;
  pvVar1->ComponentSize = local_650.ComponentSize;
  pvVar1->NumComponents = local_650.NumComponents;
  pvVar1->ComponentType = local_650.ComponentType;
  pvVar1->IsTypeless = local_650.IsTypeless;
  pvVar1->BlockWidth = local_650.BlockWidth;
  pvVar1->BlockHeight = local_650.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_660,"TEX_FORMAT_ETC2_RGB8_UNORM_SRGB",TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,'\b',
             '\x03',COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x65);
  pvVar1->Name = local_660.Name;
  pvVar1->Format = local_660.Format;
  pvVar1->ComponentSize = local_660.ComponentSize;
  pvVar1->NumComponents = local_660.NumComponents;
  pvVar1->ComponentType = local_660.ComponentType;
  pvVar1->IsTypeless = local_660.IsTypeless;
  pvVar1->BlockWidth = local_660.BlockWidth;
  pvVar1->BlockHeight = local_660.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_670,"TEX_FORMAT_ETC2_RGB8A1_UNORM",TEX_FORMAT_ETC2_RGB8A1_UNORM,'\b','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x66);
  pvVar1->Name = local_670.Name;
  pvVar1->Format = local_670.Format;
  pvVar1->ComponentSize = local_670.ComponentSize;
  pvVar1->NumComponents = local_670.NumComponents;
  pvVar1->ComponentType = local_670.ComponentType;
  pvVar1->IsTypeless = local_670.IsTypeless;
  pvVar1->BlockWidth = local_670.BlockWidth;
  pvVar1->BlockHeight = local_670.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_680,"TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB",TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,'\b',
             '\x04',COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x67);
  pvVar1->Name = local_680.Name;
  pvVar1->Format = local_680.Format;
  pvVar1->ComponentSize = local_680.ComponentSize;
  pvVar1->NumComponents = local_680.NumComponents;
  pvVar1->ComponentType = local_680.ComponentType;
  pvVar1->IsTypeless = local_680.IsTypeless;
  pvVar1->BlockWidth = local_680.BlockWidth;
  pvVar1->BlockHeight = local_680.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            (&local_690,"TEX_FORMAT_ETC2_RGBA8_UNORM",TEX_FORMAT_ETC2_RGBA8_UNORM,'\x10','\x04',
             COMPONENT_TYPE_COMPRESSED,false,'\x04','\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x68);
  pvVar1->Name = local_690.Name;
  pvVar1->Format = local_690.Format;
  pvVar1->ComponentSize = local_690.ComponentSize;
  pvVar1->NumComponents = local_690.NumComponents;
  pvVar1->ComponentType = local_690.ComponentType;
  pvVar1->IsTypeless = local_690.IsTypeless;
  pvVar1->BlockWidth = local_690.BlockWidth;
  pvVar1->BlockHeight = local_690.BlockHeight;
  TextureFormatAttribs::TextureFormatAttribs
            ((TextureFormatAttribs *)auStack_6a0,"TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB",
             TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,'\x10','\x04',COMPONENT_TYPE_COMPRESSED,false,'\x04',
             '\x04');
  pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[](&this->FmtAttribs,0x69);
  pvVar1->Name = _auStack_6a0;
  pvVar1->Format = local_698;
  pvVar1->ComponentSize = UStack_696;
  pvVar1->NumComponents = UStack_695;
  pvVar1->ComponentType = CStack_694;
  pvVar1->IsTypeless = BStack_693;
  pvVar1->BlockWidth = UStack_692;
  pvVar1->BlockHeight = UStack_691;
  for (msg.field_2._12_4_ = 0; (uint)msg.field_2._12_4_ < 0x6a;
      msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
    pvVar1 = std::array<Diligent::TextureFormatAttribs,_106UL>::operator[]
                       (&this->FmtAttribs,(ulong)(uint)msg.field_2._12_4_);
    if ((uint)pvVar1->Format != (msg.field_2._12_4_ & 0xffff)) {
      FormatString<char[21]>((string *)local_6c8,(char (*) [21])"Uninitialized format");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"FormatToTextureFormatAttribsMap",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x1a9);
      std::__cxx11::string::~string((string *)local_6c8);
    }
  }
  return;
}

Assistant:

FormatToTextureFormatAttribsMap()
        {
            // clang-format off
#define INIT_TEX_FORMAT_INFO(TexFmt, ComponentSize, NumComponents, ComponentType, IsTypeless, BlockWidth, BlockHeight) \
            FmtAttribs[ TexFmt ] = TextureFormatAttribs{#TexFmt, TexFmt, ComponentSize, NumComponents, ComponentType, IsTypeless, BlockWidth, BlockHeight};

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_TYPELESS,         4, 4, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_FLOAT,            4, 4, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_UINT,             4, 4, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_SINT,             4, 4, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_TYPELESS,          4, 3, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_FLOAT,             4, 3, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_UINT,              4, 3, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_SINT,              4, 3, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_TYPELESS,         2, 4, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_FLOAT,            2, 4, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_UNORM,            2, 4, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_UINT,             2, 4, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_SNORM,            2, 4, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_SINT,             2, 4, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_TYPELESS,           4, 2, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_FLOAT,              4, 2, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_UINT,               4, 2, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_SINT,               4, 2, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32G8X24_TYPELESS,       4, 2, COMPONENT_TYPE_DEPTH_STENCIL,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D32_FLOAT_S8X24_UINT,    4, 2, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,4, 2, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_X32_TYPELESS_G8X24_UINT, 4, 2, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB10A2_TYPELESS,        4, 1, COMPONENT_TYPE_COMPOUND,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB10A2_UNORM,           4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB10A2_UINT,            4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R11G11B10_FLOAT,         4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_TYPELESS,          1, 4, COMPONENT_TYPE_UNDEFINED,   true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM,             1, 4, COMPONENT_TYPE_UNORM,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM_SRGB,        1, 4, COMPONENT_TYPE_UNORM_SRGB, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_UINT,              1, 4, COMPONENT_TYPE_UINT,       false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_SNORM,             1, 4, COMPONENT_TYPE_SNORM,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_SINT,              1, 4, COMPONENT_TYPE_SINT,       false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_TYPELESS,           2, 2, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_FLOAT,              2, 2, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_UNORM,              2, 2, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_UINT,               2, 2, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_SNORM,              2, 2, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_SINT,               2, 2, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_TYPELESS,            4, 1, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D32_FLOAT,               4, 1, COMPONENT_TYPE_DEPTH,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_FLOAT,               4, 1, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_UINT,                4, 1, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_SINT,                4, 1, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R24G8_TYPELESS,          4, 1, COMPONENT_TYPE_DEPTH_STENCIL,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D24_UNORM_S8_UINT,       4, 1, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R24_UNORM_X8_TYPELESS,   4, 1, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_X24_TYPELESS_G8_UINT,    4, 1, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_TYPELESS,            1, 2, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_UNORM,               1, 2, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_UINT,                1, 2, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_SNORM,               1, 2, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_SINT,                1, 2, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_TYPELESS,            2, 1, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_FLOAT,               2, 1, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D16_UNORM,               2, 1, COMPONENT_TYPE_DEPTH,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_UNORM,               2, 1, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_UINT,                2, 1, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_SNORM,               2, 1, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_SINT,                2, 1, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_TYPELESS,             1, 1, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_UNORM,                1, 1, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_UINT,                 1, 1, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_SNORM,                1, 1, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_SINT,                 1, 1, COMPONENT_TYPE_SINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_A8_UNORM,                1, 1, COMPONENT_TYPE_UNORM,     false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R1_UNORM,                1, 1, COMPONENT_TYPE_UNORM,    false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB9E5_SHAREDEXP,        4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_B8G8_UNORM,          1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_G8R8_G8B8_UNORM,         1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);

            // http://www.g-truc.net/post-0335.html
            // http://renderingpipeline.com/2012/07/texture-compression/
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC1_TYPELESS,            8,  3, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC1_UNORM,               8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC1_UNORM_SRGB,          8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC2_TYPELESS,            16, 4, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC2_UNORM,               16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC2_UNORM_SRGB,          16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC3_TYPELESS,            16, 4, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC3_UNORM,               16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC3_UNORM_SRGB,          16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC4_TYPELESS,            8,  1, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC4_UNORM,               8,  1, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC4_SNORM,               8,  1, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC5_TYPELESS,            16, 2, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC5_UNORM,               16, 2, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC5_SNORM,               16, 2, COMPONENT_TYPE_COMPRESSED, false, 4,4);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_B5G6R5_UNORM,            2, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_B5G5R5A1_UNORM,          2, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM,             1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM,             1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM,  4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRA8_TYPELESS,          1, 4, COMPONENT_TYPE_UNDEFINED,     true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM_SRGB,        1, 4, COMPONENT_TYPE_UNORM_SRGB,   false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRX8_TYPELESS,          1, 4, COMPONENT_TYPE_UNDEFINED,     true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM_SRGB,        1, 4, COMPONENT_TYPE_UNORM_SRGB,   false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC6H_TYPELESS,           16, 3, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC6H_UF16,               16, 3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC6H_SF16,               16, 3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC7_TYPELESS,            16, 4, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC7_UNORM,               16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC7_UNORM_SRGB,          16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM,         8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,    8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM,       8,  4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,  8,  4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM,        16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,   16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
#undef  INIT_TEX_FORMAT_INFO
            // clang-format on
            static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Not all texture formats initialized.");

#ifdef DILIGENT_DEBUG
            for (Uint32 Fmt = TEX_FORMAT_UNKNOWN; Fmt < TEX_FORMAT_NUM_FORMATS; ++Fmt)
                VERIFY(FmtAttribs[Fmt].Format == static_cast<TEXTURE_FORMAT>(Fmt), "Uninitialized format");
#endif
        }